

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O2

void embree::SceneGraph::storeXML
               (Ref<embree::SceneGraph::Node> *root,FileName *fileName,bool embedTextures,
               bool referenceMaterials,bool binaryFormat)

{
  Node *pNVar1;
  Ref<embree::SceneGraph::Node> local_4c8;
  XMLWriter local_4c0;
  
  pNVar1 = root->ptr;
  local_4c8.ptr = pNVar1;
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
  }
  XMLWriter::XMLWriter(&local_4c0,&local_4c8,fileName,embedTextures,referenceMaterials,binaryFormat)
  ;
  XMLWriter::~XMLWriter(&local_4c0);
  if (pNVar1 != (Node *)0x0) {
    (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
  }
  return;
}

Assistant:

void SceneGraph::storeXML(Ref<SceneGraph::Node> root, const FileName& fileName, bool embedTextures, bool referenceMaterials, bool binaryFormat) {
    XMLWriter(root,fileName,embedTextures,referenceMaterials,binaryFormat);
  }